

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_DoTimerA(opm_t *chip)

{
  ushort local_12;
  uint16_t value;
  opm_t *chip_local;
  
  local_12 = chip->timer_a_val + (ushort)chip->timer_a_inc;
  chip->timer_a_of = (byte)((int)(uint)local_12 >> 10) & 1;
  if (chip->timer_a_do_reset != '\0') {
    local_12 = 0;
  }
  if (chip->timer_a_do_load != '\0') {
    local_12 = chip->timer_a_reg;
  }
  chip->timer_a_val = local_12 & 0x3ff;
  return;
}

Assistant:

static void OPM_DoTimerA(opm_t *chip)
{
    uint16_t value = chip->timer_a_val;
    value += chip->timer_a_inc;
    chip->timer_a_of = (value >> 10) & 1;
    if (chip->timer_a_do_reset)
    {
        value = 0;
    }
    if (chip->timer_a_do_load)
    {
        value = chip->timer_a_reg;
    }

    chip->timer_a_val = value & 1023;
}